

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::T_formatter::format
          (T_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  char local_66 [14];
  undefined1 local_58 [8];
  scoped_pad p;
  size_t field_size;
  memory_buffer *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  T_formatter *this_local;
  
  p.spaces_._M_str = (char *)0x8;
  scoped_pad::scoped_pad((scoped_pad *)local_58,8,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad2<500ul>(tm_time->tm_hour,dest);
  local_66[1] = 0x3a;
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_66 + 1);
  fmt_helper::pad2<500ul>(tm_time->tm_min,dest);
  local_66[0] = ':';
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_66);
  fmt_helper::pad2<500ul>(tm_time->tm_sec,dest);
  scoped_pad::~scoped_pad((scoped_pad *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 8;
        scoped_pad p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }